

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O2

void __thiscall
duckdb::StandardColumnWriter<unsigned_long,_unsigned_long,_duckdb::ParquetCastOperator>::
WriteVectorInternal<false>
          (StandardColumnWriter<unsigned_long,_unsigned_long,_duckdb::ParquetCastOperator> *this,
          WriteStream *temp_writer,ColumnWriterStatistics *stats,ColumnWriterPageState *page_state_p
          ,Vector *input_column,idx_t chunk_start,idx_t chunk_end)

{
  TemplatedValidityMask<unsigned_long> *this_00;
  bool bVar1;
  uint32_t uVar2;
  Allocator *pAVar3;
  InternalException *this_01;
  idx_t r;
  NumericStatisticsState<unsigned_long,_unsigned_long,_duckdb::BaseParquetOperator> *numeric_stats;
  WriteStream *ser;
  unsigned_long *value;
  allocator local_61;
  long local_60;
  unsigned_long target_value;
  StandardColumnWriter<unsigned_long,_unsigned_long,_duckdb::ParquetCastOperator> *local_38;
  
  ser = (WriteStream *)chunk_start;
  local_38 = this;
  FlatVector::VerifyFlatVector(input_column);
  if (*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState < 10) {
    this_00 = (TemplatedValidityMask<unsigned_long> *)(input_column + 0x28);
    local_60 = *(long *)(input_column + 0x20);
    switch(*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
    case 0:
      if (*(long *)this_00 != 0) {
        TemplatedWritePlain<unsigned_long,unsigned_long,duckdb::ParquetCastOperator,false>
                  (input_column,stats,chunk_start,chunk_end,(ValidityMask *)this_00,temp_writer);
        return;
      }
      TemplatedWritePlain<unsigned_long,unsigned_long,duckdb::ParquetCastOperator,true>
                (input_column,stats,chunk_start,chunk_end,(ValidityMask *)temp_writer,ser);
      return;
    default:
      goto switchD_002b8927_caseD_1;
    case 5:
      if (*(char *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) == '\0') {
        for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
          bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,chunk_start);
          if (bVar1) {
            target_value = *(ulong *)(local_60 + chunk_start * 8);
            if (target_value < stats[1]._vptr_ColumnWriterStatistics) {
              stats[1]._vptr_ColumnWriterStatistics = (_func_int **)target_value;
            }
            if (stats[2]._vptr_ColumnWriterStatistics < target_value) {
              stats[2]._vptr_ColumnWriterStatistics = (_func_int **)target_value;
            }
            DbpEncoder::BeginWrite<unsigned_long>
                      ((DbpEncoder *)(page_state_p + 2),temp_writer,&target_value);
            *(undefined1 *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) = 1;
            chunk_start = chunk_start + 1;
            break;
          }
        }
      }
      for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,chunk_start);
        if (bVar1) {
          target_value = *(ulong *)(local_60 + chunk_start * 8);
          if (target_value < stats[1]._vptr_ColumnWriterStatistics) {
            stats[1]._vptr_ColumnWriterStatistics = (_func_int **)target_value;
          }
          if (stats[2]._vptr_ColumnWriterStatistics < target_value) {
            stats[2]._vptr_ColumnWriterStatistics = (_func_int **)target_value;
          }
          DbpEncoder::WriteValue<unsigned_long>
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,&target_value);
        }
      }
      break;
    case 6:
      if (*(char *)&page_state_p[0x908]._vptr_ColumnWriterPageState == '\0') {
        for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
          bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,chunk_start);
          if (bVar1) {
            target_value = *(ulong *)(local_60 + chunk_start * 8);
            if (target_value < stats[1]._vptr_ColumnWriterStatistics) {
              stats[1]._vptr_ColumnWriterStatistics = (_func_int **)target_value;
            }
            if (stats[2]._vptr_ColumnWriterStatistics < target_value) {
              stats[2]._vptr_ColumnWriterStatistics = (_func_int **)target_value;
            }
            pAVar3 = (Allocator *)
                     duckdb::BufferAllocator::Get
                               (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)
                                ->context);
            DlbaEncoder::BeginWrite<unsigned_long>
                      ((DlbaEncoder *)(page_state_p + 0x909),pAVar3,temp_writer,&target_value);
            *(undefined1 *)&page_state_p[0x908]._vptr_ColumnWriterPageState = 1;
            chunk_start = chunk_start + 1;
            break;
          }
        }
      }
      for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,chunk_start);
        if (bVar1) {
          target_value = *(ulong *)(local_60 + chunk_start * 8);
          if (target_value < stats[1]._vptr_ColumnWriterStatistics) {
            stats[1]._vptr_ColumnWriterStatistics = (_func_int **)target_value;
          }
          if (stats[2]._vptr_ColumnWriterStatistics < target_value) {
            stats[2]._vptr_ColumnWriterStatistics = (_func_int **)target_value;
          }
          DlbaEncoder::WriteValue<unsigned_long>
                    ((DlbaEncoder *)(page_state_p + 0x909),temp_writer,&target_value);
        }
      }
      break;
    case 8:
      if (*(char *)&page_state_p[0x121c]._vptr_ColumnWriterPageState == '\0') {
        for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
          bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,chunk_start);
          if (bVar1) {
            target_value = CONCAT71(target_value._1_7_,
                                    *(undefined1 *)
                                     ((long)&page_state_p[0x121c]._vptr_ColumnWriterPageState + 4));
            (*(code *)**(undefined8 **)temp_writer)(temp_writer,&target_value,1);
            page_state_p[0x121f]._vptr_ColumnWriterPageState = (_func_int **)0x0;
            page_state_p[0x1320]._vptr_ColumnWriterPageState = (_func_int **)0x0;
            *(undefined1 *)&page_state_p[0x121c]._vptr_ColumnWriterPageState = 1;
            break;
          }
        }
      }
      value = (unsigned_long *)(local_60 + chunk_start * 8);
      for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,chunk_start);
        if (bVar1) {
          uVar2 = PrimitiveDictionary<unsigned_long,_unsigned_long,_duckdb::ParquetCastOperator>::
                  GetIndex((PrimitiveDictionary<unsigned_long,_unsigned_long,_duckdb::ParquetCastOperator>
                            *)page_state_p[0x121b]._vptr_ColumnWriterPageState,value);
          target_value = CONCAT44(target_value._4_4_,uVar2);
          RleBpEncoder::WriteValue
                    ((RleBpEncoder *)(page_state_p + 0x121d),temp_writer,(uint32_t *)&target_value);
        }
        value = value + 1;
      }
      break;
    case 9:
      if (*(char *)&page_state_p[0x1214]._vptr_ColumnWriterPageState == '\x01') {
        pAVar3 = (Allocator *)
                 duckdb::BufferAllocator::Get
                           (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                            context);
        BssEncoder::BeginWrite((BssEncoder *)(page_state_p + 0x1215),pAVar3);
        *(undefined1 *)&page_state_p[0x1214]._vptr_ColumnWriterPageState = 1;
      }
      for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,chunk_start);
        if (bVar1) {
          target_value = *(ulong *)(local_60 + chunk_start * 8);
          if (target_value < stats[1]._vptr_ColumnWriterStatistics) {
            stats[1]._vptr_ColumnWriterStatistics = (_func_int **)target_value;
          }
          if (stats[2]._vptr_ColumnWriterStatistics < target_value) {
            stats[2]._vptr_ColumnWriterStatistics = (_func_int **)target_value;
          }
          BssEncoder::WriteValue<unsigned_long>((BssEncoder *)(page_state_p + 0x1215),&target_value)
          ;
        }
      }
    }
    return;
  }
switchD_002b8927_caseD_1:
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&target_value,"Unknown encoding",&local_61);
  duckdb::InternalException::InternalException(this_01,(string *)&target_value);
  __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}